

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::TestOneofParsingLite::set_allocated_oneof_submessage
          (TestOneofParsingLite *this,TestAllTypesLite *oneof_submessage)

{
  Arena *submessage_arena;
  Arena *message_arena;
  
  message_arena = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)message_arena & 1) != 0) {
    message_arena = *(Arena **)((ulong)message_arena & 0xfffffffffffffffe);
  }
  clear_oneof_field(this);
  if (oneof_submessage != (TestAllTypesLite *)0x0) {
    submessage_arena = (Arena *)(oneof_submessage->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 1) != 0) {
      submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffe);
    }
    if (message_arena != submessage_arena) {
      oneof_submessage =
           (TestAllTypesLite *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&oneof_submessage->super_MessageLite,submessage_arena);
    }
    (this->field_0)._impl_._oneof_case_[0] = 2;
    (this->field_0)._impl_.oneof_field_.oneof_submessage_ = oneof_submessage;
  }
  return;
}

Assistant:

void TestOneofParsingLite::set_allocated_oneof_submessage(::proto2_unittest::TestAllTypesLite* PROTOBUF_NULLABLE oneof_submessage) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (oneof_submessage) {
    ::google::protobuf::Arena* submessage_arena = oneof_submessage->GetArena();
    if (message_arena != submessage_arena) {
      oneof_submessage = ::google::protobuf::internal::GetOwnedMessage(message_arena, oneof_submessage, submessage_arena);
    }
    set_has_oneof_submessage();
    _impl_.oneof_field_.oneof_submessage_ = oneof_submessage;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.TestOneofParsingLite.oneof_submessage)
}